

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O0

bool $_0::convertToBool<QByteArray,char_const*>(QByteArray *source)

{
  long lVar1;
  bool bVar2;
  char **in_RDI;
  long in_FS_OFFSET;
  QByteArray str;
  QByteArray *in_stack_ffffffffffffffb8;
  bool local_39;
  QByteArray *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArray::toLower(in_stack_ffffffffffffffb8);
  bVar2 = QByteArray::isEmpty((QByteArray *)0x3a33f4);
  local_39 = true;
  if (!bVar2) {
    bVar2 = ::operator==(in_stack_ffffffffffffffd0,in_RDI);
    local_39 = true;
    if (!bVar2) {
      local_39 = ::operator==((QByteArray *)"false",in_RDI);
    }
  }
  QByteArray::~QByteArray((QByteArray *)0x3a345c);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(local_39 ^ 1);
  }
  __stack_chk_fail();
}

Assistant:

static inline bool convertToBool(const T &source)
    {
        T str = source.toLower();
        return !(str.isEmpty() || str == LiteralWrapper("0") || str == LiteralWrapper("false"));
    }